

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O3

string * duckdb::Base64Decode(string *__return_storage_ptr__,string *key)

{
  string_t str;
  data_ptr_t output;
  void *pvVar1;
  uint uVar2;
  pointer pcVar3;
  idx_t in_R8;
  undefined8 unaff_R15;
  string_t str_00;
  undefined8 unaff_retaddr;
  undefined4 uStackY_3c;
  undefined4 uStackY_38;
  undefined4 local_34;
  uint local_30;
  undefined8 uStackY_2c;
  undefined4 local_24;
  
  pcVar3 = (key->_M_dataplus)._M_p;
  local_30 = (uint)key->_M_string_length;
  if (local_30 < 0xd) {
    local_24 = 0;
    uStackY_2c = 0;
    if (local_30 != 0) {
      switchD_012b9b0d::default(&uStackY_2c,pcVar3,(ulong)(local_30 & 0xf));
    }
  }
  else {
    uStackY_2c = CONCAT44(uStackY_2c._4_4_,*(undefined4 *)pcVar3);
  }
  str.value.pointer.ptr = (char *)unaff_retaddr;
  str.value._0_8_ = unaff_R15;
  output = (data_ptr_t)Blob::FromBase64Size(str);
  pvVar1 = operator_new__((ulong)output);
  pcVar3 = (key->_M_dataplus)._M_p;
  uVar2 = (uint)key->_M_string_length;
  if (uVar2 < 0xd) {
    local_34 = 0;
    uStackY_3c = 0;
    uStackY_38 = 0;
    if (uVar2 == 0) {
      pcVar3 = (pointer)0x0;
    }
    else {
      switchD_012b9b0d::default(&uStackY_3c,pcVar3,(ulong)(uVar2 & 0xf));
      pcVar3 = (pointer)CONCAT44(local_34,uStackY_38);
    }
  }
  else {
    uStackY_3c = *(undefined4 *)pcVar3;
  }
  str_00.value.pointer.ptr = (char *)pvVar1;
  str_00.value._0_8_ = pcVar3;
  Blob::FromBase64((Blob *)CONCAT44(uStackY_3c,uVar2),str_00,output,in_R8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pvVar1,(data_ptr_t)((long)pvVar1 + (long)output));
  operator_delete__(pvVar1);
  return __return_storage_ptr__;
}

Assistant:

string Base64Decode(const string &key) {
	auto result_size = Blob::FromBase64Size(key);
	auto output = duckdb::unique_ptr<unsigned char[]>(new unsigned char[result_size]);
	Blob::FromBase64(key, output.get(), result_size);
	string decoded_key(reinterpret_cast<const char *>(output.get()), result_size);
	return decoded_key;
}